

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gena_device.c
# Opt level: O0

int genaNotify(char *headers,char *propertySet,subscription *sub)

{
  int iVar1;
  int local_24c;
  undefined1 local_248 [4];
  int return_code;
  http_parser_t response;
  uri_type *url;
  membuffer mid_msg;
  size_t i;
  subscription *sub_local;
  char *propertySet_local;
  char *headers_local;
  
  local_24c = -1;
  membuffer_init((membuffer *)&url);
  iVar1 = http_MakeMessage((membuffer *)&url,1,1,"ssscsdcc",headers,"SID: ",sub,"SEQ: ",
                           sub->ToSendEventKey);
  if (iVar1 == 0) {
    for (mid_msg.size_inc = 0; mid_msg.size_inc < (sub->DeliveryURLs).size;
        mid_msg.size_inc = mid_msg.size_inc + 1) {
      response.scanner._16_8_ = (sub->DeliveryURLs).parsedURLs + mid_msg.size_inc;
      local_24c = notify_send_and_recv
                            ((uri_type *)response.scanner._16_8_,(membuffer *)&url,propertySet,
                             (http_parser_t *)local_248);
      if (local_24c == 0) break;
    }
    membuffer_destroy((membuffer *)&url);
    if (local_24c == 0) {
      if (response.msg.uri.hostport.IPaddress.__ss_align._4_4_ == 200) {
        local_24c = 0;
      }
      else if (response.msg.uri.hostport.IPaddress.__ss_align._4_4_ == 0x19c) {
        local_24c = -9;
      }
      else {
        local_24c = -0x12f;
      }
      httpmsg_destroy((http_message_t *)local_248);
    }
    headers_local._4_4_ = local_24c;
  }
  else {
    membuffer_destroy((membuffer *)&url);
    headers_local._4_4_ = -0x68;
  }
  return headers_local._4_4_;
}

Assistant:

static int genaNotify(
	/*! [in] Null terminated, includes all headers (including \\r\\n) except
	   SID and SEQ. */
	char *headers,
	/*! [in] The evented XML. */
	char *propertySet,
	/*! [in] subscription to be Notified, assumes this is valid for life of
	   function. */
	subscription *sub)
{
	size_t i;
	membuffer mid_msg;
	uri_type *url;
	http_parser_t response;
	int return_code = -1;

	membuffer_init(&mid_msg);
	if (http_MakeMessage(&mid_msg,
		    1,
		    1,
		    "s"
		    "ssc"
		    "sdcc",
		    headers,
		    "SID: ",
		    sub->sid,
		    "SEQ: ",
		    sub->ToSendEventKey) != 0) {
		membuffer_destroy(&mid_msg);
		return UPNP_E_OUTOF_MEMORY;
	}
	/* send a notify to each url until one goes thru */
	for (i = 0; i < sub->DeliveryURLs.size; i++) {
		url = &sub->DeliveryURLs.parsedURLs[i];
		return_code = notify_send_and_recv(
			url, &mid_msg, propertySet, &response);
		if (return_code == UPNP_E_SUCCESS)
			break;
	}
	membuffer_destroy(&mid_msg);
	if (return_code == UPNP_E_SUCCESS) {
		if (response.msg.status_code == HTTP_OK)
			return_code = GENA_SUCCESS;
		else {
			if (response.msg.status_code ==
				HTTP_PRECONDITION_FAILED)
				/*Invalid SID gets removed */
				return_code =
					GENA_E_NOTIFY_UNACCEPTED_REMOVE_SUB;
			else
				return_code = GENA_E_NOTIFY_UNACCEPTED;
		}
		httpmsg_destroy(&response.msg);
	}

	return return_code;
}